

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

void int_pow(IntVar *x,IntVar *y,IntVar *z)

{
  IntView<0> _z;
  PowerPos<0,_0,_0> *this;
  IntView<0> _x;
  IntView<0> _y;
  
  if ((-1 < (x->min).v) && (0 < (y->min).v)) {
    int_rel(z,IRT_GE,0);
    this = (PowerPos<0,_0,_0> *)operator_new(0x48);
    _z.a = 1;
    _z.b = 0;
    _z.var = z;
    _x.a = 1;
    _x.b = 0;
    _x.var = x;
    _y.a = 1;
    _y.b = 0;
    _y.var = y;
    PowerPos<0,_0,_0>::PowerPos(this,_x,_y,_z);
    return;
  }
  fprintf(_stderr,"%s:%d: ","arithmetic.cpp",0xfc);
  fwrite("The constraint int_pow is not yet supported for non-negative base and exponent integer!",
         0x57,1,_stderr);
  abort();
}

Assistant:

void int_pow(IntVar* x, IntVar* y, IntVar* z) {
	// Since we are dealing with integer the exponent 'y' must be at least -1
	// int_rel(y, IRT_GE, -1);
	if (0 <= x->getMin() && 0 < y->getMin()) {
		int_rel(z, IRT_GE, 0);
		new PowerPos<0, 0, 0>(IntView<>(x), IntView<>(y), IntView<>(z));
	} else {
		CHUFFED_ERROR(
				"The constraint int_pow is not yet supported for non-negative base and exponent integer!");
	}
}